

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O2

void sssort64(sauchar_t *T,saidx64_t *PA,saidx64_t *first,saidx64_t *last,saidx64_t *buf,
             saidx64_t bufsize,saidx64_t depth,saidx64_t n,saint_t lastsuffix)

{
  ulong uVar1;
  long lVar2;
  saint_t sVar3;
  long lVar4;
  ulong uVar5;
  ulong *puVar6;
  uint uVar7;
  ulong uVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *last_00;
  ulong *puVar12;
  ulong *puVar13;
  ulong *a;
  ulong *puVar14;
  ulong *puVar15;
  ulong *puVar16;
  int iVar17;
  long lVar18;
  bool bVar19;
  ulong *local_70;
  saidx64_t PAi [2];
  
  puVar6 = (ulong *)(first + 1);
  puVar16 = puVar6;
  if (lastsuffix == 0) {
    puVar16 = (ulong *)first;
  }
  if (bufsize < 0x400) {
    uVar8 = (long)last - (long)puVar16;
    uVar10 = (long)uVar8 >> 3;
    if (bufsize < (long)uVar10) {
      lVar4 = 0x400;
      if ((long)uVar10 < 0x100000) {
        if ((uVar8 & 0x7fff80000) == 0) {
          if ((uVar8 & 0x7f800) == 0) {
            uVar7 = lg_table[uVar10 & 0xff];
          }
          else {
            uVar7 = lg_table[uVar10 >> 8 & 0xff] + 8;
          }
        }
        else if ((uVar8 & 0x7f8000000) == 0) {
          uVar7 = *(int *)((long)lg_table + (ulong)((uint)(uVar10 >> 0xe) & 0x3fc)) + 0x10;
        }
        else {
          uVar7 = lg_table[uVar10 >> 0x18 & 0xff] + 0x18;
        }
        if ((int)uVar7 < 0x10) {
          if ((int)uVar7 < 8) {
            lVar4 = (long)(sqq_table[uVar10] >> 4);
            goto LAB_00101c57;
          }
          lVar4 = (long)((sqq_table[(long)uVar10 >> (((byte)uVar7 & 0xfe) - 6 & 0x3f)] >>
                         (7U - (char)(uVar7 >> 1) & 0x1f)) + 1);
        }
        else {
          lVar4 = (long)(sqq_table[(long)uVar10 >> (((byte)uVar7 & 0xfe) - 6 & 0x3f)] <<
                        ((char)(uVar7 >> 1) - 7U & 0x1f));
          if (0x17 < uVar7) {
            lVar4 = lVar4 + (long)uVar10 / lVar4 + 1 >> 1;
          }
          lVar4 = (long)uVar10 / lVar4 + lVar4 + 1 >> 1;
        }
        lVar4 = lVar4 - (ulong)(lVar4 * lVar4 - uVar10 != 0 && (long)uVar10 <= lVar4 * lVar4);
      }
LAB_00101c57:
      if (bufsize < lVar4) {
        bufsize = 0x400;
        if (lVar4 < 0x400) {
          bufsize = lVar4;
        }
        local_70 = (ulong *)(last + -bufsize);
        bVar19 = lVar4 == 0;
        last_00 = local_70;
        goto LAB_00101c88;
      }
    }
  }
  bVar19 = true;
  last_00 = (ulong *)last;
  local_70 = (ulong *)buf;
LAB_00101c88:
  uVar8 = 0;
  puVar9 = puVar16;
  while (0x2000 < (long)last_00 - (long)puVar9) {
    puVar12 = puVar9 + 0x400;
    ss_mintrosort(T,PA,(saidx64_t *)puVar9,(saidx64_t *)puVar12,depth);
    lVar4 = (long)last - (long)puVar12 >> 3;
    puVar13 = puVar12;
    if (lVar4 <= bufsize) {
      lVar4 = bufsize;
      puVar13 = local_70;
    }
    lVar18 = 0x400;
    for (uVar10 = uVar8; (uVar10 & 1) != 0; uVar10 = uVar10 >> 1) {
      lVar2 = -lVar18;
      ss_swapmerge(T,PA,(saidx64_t *)(puVar9 + lVar2),(saidx64_t *)puVar9,
                   (saidx64_t *)(puVar9 + lVar18),(saidx64_t *)puVar13,lVar4,depth);
      lVar18 = lVar18 * 2;
      puVar9 = puVar9 + lVar2;
    }
    uVar8 = uVar8 + 1;
    puVar9 = puVar12;
  }
  ss_mintrosort(T,PA,(saidx64_t *)puVar9,(saidx64_t *)last_00,depth);
  lVar4 = 0x400;
  for (; uVar8 != 0; uVar8 = uVar8 >> 1) {
    puVar12 = puVar9;
    if ((uVar8 & 1) != 0) {
      puVar12 = puVar9 + -lVar4;
      ss_swapmerge(T,PA,(saidx64_t *)puVar12,(saidx64_t *)puVar9,(saidx64_t *)last_00,
                   (saidx64_t *)local_70,bufsize,depth);
    }
    lVar4 = lVar4 * 2;
    puVar9 = puVar12;
  }
  if (!bVar19) {
    ss_mintrosort(T,PA,(saidx64_t *)last_00,last,depth);
    puVar9 = (ulong *)last;
    do {
      uVar8 = puVar9[-1];
      lVar4 = (long)last_00 - (long)puVar16 >> 3;
      lVar18 = (long)last_00 - (long)puVar16 >> 4;
      iVar17 = -1;
      puVar12 = puVar16;
      while (0 < lVar4) {
        uVar10 = (puVar12 + lVar18 + 1)[-1];
        sVar3 = ss_compare(T,PA + ((long)uVar10 >> 0x3f ^ uVar10),PA + ((long)uVar8 >> 0x3f ^ uVar8)
                           ,depth);
        uVar10 = (ulong)(~(uint)lVar4 & 1);
        puVar13 = puVar12 + lVar18 + 1;
        if (-1 < sVar3) {
          uVar10 = 0;
          iVar17 = sVar3;
          puVar13 = puVar12;
        }
        puVar12 = puVar13;
        lVar4 = lVar18 - uVar10;
        lVar18 = lVar4 >> 1;
      }
      if (puVar12 < last_00) {
        if (iVar17 == 0) {
          *puVar12 = ~*puVar12;
        }
        uVar11 = (long)last_00 - (long)puVar12 >> 3;
        uVar5 = (long)puVar9 - (long)last_00 >> 3;
        uVar10 = uVar11;
        puVar13 = puVar9;
        a = puVar12;
LAB_00101ee5:
        do {
          if (((long)uVar10 < 1) || ((long)uVar5 < 1)) {
LAB_00101f89:
            if (puVar12 == puVar16) goto LAB_00101fc4;
            puVar9 = puVar9 + -uVar11;
            last_00 = puVar12;
            break;
          }
          if (uVar10 == uVar5) {
            ss_blockswap((saidx64_t *)a,(saidx64_t *)last_00,uVar10);
            goto LAB_00101f89;
          }
          if (uVar5 <= uVar10) goto LAB_00101f35;
          do {
            puVar13 = puVar13 + -1;
            uVar1 = *puVar13;
            puVar15 = last_00 + -1;
            do {
              *puVar13 = *puVar15;
              puVar14 = puVar13 + -1;
              puVar13 = puVar13 + -1;
              *puVar15 = *puVar14;
              puVar15 = puVar15 + -1;
            } while (a <= puVar15);
            *puVar13 = uVar1;
            uVar5 = uVar5 + ~uVar10;
          } while ((long)uVar10 < (long)uVar5);
        } while( true );
      }
      while (puVar9 = puVar9 + -1, (long)uVar8 < 0) {
        uVar8 = puVar9[-1];
      }
    } while (last_00 != puVar9);
  }
LAB_00101fc4:
  if (lastsuffix != 0) {
    uVar8 = *first;
    PAi[0] = PA[uVar8];
    PAi[1] = n + -2;
    while ((puVar6 < last &&
           ((uVar10 = *puVar6, (long)uVar10 < 0 ||
            (sVar3 = ss_compare(T,PAi,PA + uVar10,depth), 0 < sVar3))))) {
      puVar6[-1] = uVar10;
      puVar6 = puVar6 + 1;
    }
    puVar6[-1] = uVar8;
  }
  return;
LAB_00101f35:
  do {
    uVar1 = *a;
    a = a + 1;
    puVar15 = last_00;
    do {
      puVar14 = a;
      puVar14[-1] = *puVar15;
      *puVar15 = *puVar14;
      puVar15 = puVar15 + 1;
      a = puVar14 + 1;
    } while (puVar15 < puVar13);
    *puVar14 = uVar1;
    uVar10 = uVar10 + ~uVar5;
  } while ((long)uVar5 < (long)uVar10);
  goto LAB_00101ee5;
}

Assistant:

void
sssort(const sauchar_t *T, const saidx_t *PA,
       saidx_t *first, saidx_t *last,
       saidx_t *buf, saidx_t bufsize,
       saidx_t depth, saidx_t n, saint_t lastsuffix) {
  saidx_t *a;
#if SS_BLOCKSIZE != 0
  saidx_t *b, *middle, *curbuf;
  saidx_t j, k, curbufsize, limit;
#endif
  saidx_t i;

  if(lastsuffix != 0) { ++first; }

#if SS_BLOCKSIZE == 0
  ss_mintrosort(T, PA, first, last, depth);
#else
  if((bufsize < SS_BLOCKSIZE) &&
      (bufsize < (last - first)) &&
      (bufsize < (limit = ss_isqrt(last - first)))) {
    if(SS_BLOCKSIZE < limit) { limit = SS_BLOCKSIZE; }
    buf = middle = last - limit, bufsize = limit;
  } else {
    middle = last, limit = 0;
  }
  for(a = first, i = 0; SS_BLOCKSIZE < (middle - a); a += SS_BLOCKSIZE, ++i) {
#if SS_INSERTIONSORT_THRESHOLD < SS_BLOCKSIZE
    ss_mintrosort(T, PA, a, a + SS_BLOCKSIZE, depth);
#elif 1 < SS_BLOCKSIZE
    ss_insertionsort(T, PA, a, a + SS_BLOCKSIZE, depth);
#endif
    curbufsize = last - (a + SS_BLOCKSIZE);
    curbuf = a + SS_BLOCKSIZE;
    if(curbufsize <= bufsize) { curbufsize = bufsize, curbuf = buf; }
    for(b = a, k = SS_BLOCKSIZE, j = i; j & 1; b -= k, k <<= 1, j >>= 1) {
      ss_swapmerge(T, PA, b - k, b, b + k, curbuf, curbufsize, depth);
    }
  }
#if SS_INSERTIONSORT_THRESHOLD < SS_BLOCKSIZE
  ss_mintrosort(T, PA, a, middle, depth);
#elif 1 < SS_BLOCKSIZE
  ss_insertionsort(T, PA, a, middle, depth);
#endif
  for(k = SS_BLOCKSIZE; i != 0; k <<= 1, i >>= 1) {
    if(i & 1) {
      ss_swapmerge(T, PA, a - k, a, middle, buf, bufsize, depth);
      a -= k;
    }
  }
  if(limit != 0) {
#if SS_INSERTIONSORT_THRESHOLD < SS_BLOCKSIZE
    ss_mintrosort(T, PA, middle, last, depth);
#elif 1 < SS_BLOCKSIZE
    ss_insertionsort(T, PA, middle, last, depth);
#endif
    ss_inplacemerge(T, PA, first, middle, last, depth);
  }
#endif

  if(lastsuffix != 0) {
    /* Insert last type B* suffix. */
    saidx_t PAi[2]; PAi[0] = PA[*(first - 1)], PAi[1] = n - 2;
    for(a = first, i = *(first - 1);
        (a < last) && ((*a < 0) || (0 < ss_compare(T, &(PAi[0]), PA + *a, depth)));
        ++a) {
      *(a - 1) = *a;
    }
    *(a - 1) = i;
  }
}